

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::ComputeShaderGeneratedCase::iterate
          (ComputeShaderGeneratedCase *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  RenderTarget *pRVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  OutOfMemoryError *anon_var_0;
  Bitfield<16UL> local_988;
  MessageBuilder local_970;
  int local_7ec;
  char *pcStack_7e8;
  GLuint barriers;
  char *local_7e0;
  char *local_7d8;
  MessageBuilder local_7d0;
  MessageBuilder local_650;
  MessageBuilder local_4d0;
  MessageBuilder local_350;
  MessageBuilder local_1c0;
  undefined1 local_40 [8];
  Surface surface;
  Functions *gl;
  int renderTargetHeight;
  int renderTargetWidth;
  ComputeShaderGeneratedCase *this_local;
  
  pRVar5 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar2 = tcu::RenderTarget::getWidth(pRVar5);
  iVar2 = de::min<int>(0x400,iVar2);
  pRVar5 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar3 = tcu::RenderTarget::getHeight(pRVar5);
  iVar3 = de::min<int>(0x400,iVar3);
  pRVar6 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  surface.m_pixels.m_cap = CONCAT44(extraout_var,iVar4);
  tcu::Surface::Surface((Surface *)local_40,iVar2,iVar3);
  pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1c0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_1c0,(char (*) [19])"Preparing to draw ");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&this->m_gridSize);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [4])" x ");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&this->m_gridSize);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [7])0x2c30586);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1c0);
  if ((this->m_computeCmd & 1U) == 0) {
    pTVar7 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_350,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<
                       (&local_350,(char (*) [31])"Uploading draw command buffer.");
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_350);
    createDrawCommand(this);
  }
  if ((this->m_computeData & 1U) == 0) {
    pTVar7 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_4d0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<
                       (&local_4d0,(char (*) [28])"Uploading draw data buffer.");
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4d0);
    createDrawData(this);
  }
  if (((this->m_computeIndices & 1U) == 0) && (this->m_drawMethod == DRAWMETHOD_DRAWELEMENTS)) {
    pTVar7 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_650,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<
                       (&local_650,(char (*) [29])"Uploading draw index buffer.");
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_650);
    createDrawIndices(this);
  }
  pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_7d0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<
                     (&local_7d0,(char (*) [49])"Filling following buffers using compute shader:\n")
  ;
  local_7d8 = "";
  if ((this->m_computeCmd & 1U) != 0) {
    local_7d8 = "\tcommand buffer\n";
  }
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_7d8);
  local_7e0 = "";
  if ((this->m_computeData & 1U) != 0) {
    local_7e0 = "\tdata buffer\n";
  }
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_7e0);
  pcStack_7e8 = "";
  if ((this->m_computeIndices & 1U) != 0) {
    pcStack_7e8 = "\tindex buffer\n";
  }
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&stack0xfffffffffffff818);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_7d0);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
  local_7ec = ((this->m_computeCmd & 1) << 6 | this->m_computeData & 1) +
              (this->m_computeIndices & 1) * 2;
  pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_970,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_970,(char (*) [28])"Memory barrier. Barriers = ");
  glu::getMemoryBarrierFlagsStr(&local_988,local_7ec);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_988);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_970);
  (**(code **)(surface.m_pixels.m_cap + 0xdb8))(local_7ec);
  pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&anon_var_0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&anon_var_0,(char (*) [27])"Drawing from buffers with ");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&this->m_numDrawCmds);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [15])" draw call(s).");
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&anon_var_0);
  renderTo(this,(Surface *)local_40);
  pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  bVar1 = verifyImageYellowGreen((Surface *)local_40,pTVar7);
  if (bVar1) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Result image invalid");
  }
  tcu::Surface::~Surface((Surface *)local_40);
  return STOP;
}

Assistant:

ComputeShaderGeneratedCase::IterateResult ComputeShaderGeneratedCase::iterate (void)
{
	const int				renderTargetWidth	= de::min(1024, m_context.getRenderTarget().getWidth());
	const int				renderTargetHeight	= de::min(1024, m_context.getRenderTarget().getHeight());
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	tcu::Surface			surface				(renderTargetWidth, renderTargetHeight);

	m_testCtx.getLog() << tcu::TestLog::Message << "Preparing to draw " << m_gridSize << " x " << m_gridSize << " grid." << tcu::TestLog::EndMessage;

	try
	{
		// Gen command buffer
		if (!m_computeCmd)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Uploading draw command buffer." << tcu::TestLog::EndMessage;
			createDrawCommand();
		}

		// Gen data buffer
		if (!m_computeData)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Uploading draw data buffer." << tcu::TestLog::EndMessage;
			createDrawData();
		}

		// Gen index buffer
		if (!m_computeIndices && m_drawMethod == DRAWMETHOD_DRAWELEMENTS)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Uploading draw index buffer." << tcu::TestLog::EndMessage;
			createDrawIndices();
		}

		// Run compute shader
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message << "Filling following buffers using compute shader:\n"
				<< ((m_computeCmd)		? ("\tcommand buffer\n")	: (""))
				<< ((m_computeData)		? ("\tdata buffer\n")		: (""))
				<< ((m_computeIndices)	? ("\tindex buffer\n")		: (""))
				<< tcu::TestLog::EndMessage;
			runComputeShader();
		}

		// Ensure data is written to the buffers before we try to read it
		{
			const glw::GLuint barriers = ((m_computeCmd)     ? (GL_COMMAND_BARRIER_BIT)             : (0)) |
										 ((m_computeData)    ? (GL_VERTEX_ATTRIB_ARRAY_BARRIER_BIT) : (0)) |
										 ((m_computeIndices) ? (GL_ELEMENT_ARRAY_BARRIER_BIT)       : (0));

			m_testCtx.getLog() << tcu::TestLog::Message << "Memory barrier. Barriers = " << glu::getMemoryBarrierFlagsStr(barriers) << tcu::TestLog::EndMessage;
			gl.memoryBarrier(barriers);
		}

		// Draw from buffers

		m_testCtx.getLog() << tcu::TestLog::Message << "Drawing from buffers with " << m_numDrawCmds << " draw call(s)." << tcu::TestLog::EndMessage;
		renderTo(surface);
	}
	catch (glu::OutOfMemoryError&)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Got GL_OUT_OF_MEMORY." << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Got GL_OUT_OF_MEMORY");
		m_testCtx.setTerminateAfter(true); // Do not rely on implementation to be able to recover from OOM
		return STOP;
	}


	// verify image
	// \note the green/yellow pattern is only for clarity. The test will only verify that all grid cells were drawn by looking for anything non-green/yellow.
	if (verifyImageYellowGreen(surface, m_testCtx.getLog()))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Result image invalid");
	return STOP;
}